

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

void ExtractTranslationSampler
               (Asset *asset,string *animId,Ref<glTF2::Buffer> *buffer,aiNodeAnim *nodeChannel,
               float ticksPerSecond,Sampler *sampler)

{
  aiVectorKey *paVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong __n;
  Ref<glTF2::Accessor> RVar5;
  allocator_type local_65;
  float local_64;
  vector<float,_std::allocator<float>_> values;
  vector<float,_std::allocator<float>_> times;
  
  uVar3 = nodeChannel->mNumPositionKeys;
  __n = (ulong)uVar3;
  if (__n != 0) {
    local_64 = ticksPerSecond;
    std::vector<float,_std::allocator<float>_>::vector(&times,__n,(allocator_type *)&values);
    std::vector<float,_std::allocator<float>_>::vector(&values,(ulong)(uVar3 * 3),&local_65);
    uVar2 = 2;
    uVar3 = 1;
    uVar4 = 0;
    do {
      paVar1 = nodeChannel->mPositionKeys;
      times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = (float)(*(double *)((long)paVar1 + uVar2 * 8 + -0x10) / (double)local_64);
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3 - 1] = *(float *)((long)paVar1 + uVar2 * 8 + -8);
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3] = *(float *)((long)paVar1 + uVar2 * 8 + -4);
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar2 & 0xffffffff] = *(float *)(&paVar1->mTime + uVar2);
      uVar4 = uVar4 + 1;
      uVar2 = uVar2 + 3;
      uVar3 = uVar3 + 3;
    } while (__n != uVar4);
    RVar5 = ExportData(asset,animId,buffer,
                       (ulong)((long)times.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2 & 0xffffffff,
                       times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,SCALAR,SCALAR,ComponentType_FLOAT,false);
    (sampler->input).vector = RVar5.vector;
    (sampler->input).index = RVar5.index;
    RVar5 = ExportData(asset,animId,buffer,__n,
                       values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,VEC3,VEC3,ComponentType_FLOAT,false);
    (sampler->output).vector = RVar5.vector;
    (sampler->output).index = RVar5.index;
    sampler->interpolation = Interpolation_LINEAR;
    if (values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)times.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

inline void ExtractTranslationSampler(Asset& asset, std::string& animId, Ref<Buffer>& buffer, const aiNodeAnim* nodeChannel, float ticksPerSecond, Animation::Sampler& sampler)
{
    const unsigned int numKeyframes = nodeChannel->mNumPositionKeys;
    if (numKeyframes == 0) {
        return;
    }

    std::vector<float> times(numKeyframes);
    std::vector<float> values(numKeyframes * 3);
    for (unsigned int i = 0; i < numKeyframes; ++i) {
        const aiVectorKey& key = nodeChannel->mPositionKeys[i];
        // mTime is measured in ticks, but GLTF time is measured in seconds, so convert.
        times[i] = static_cast<float>(key.mTime / ticksPerSecond);
        values[(i * 3) + 0] = key.mValue.x;
        values[(i * 3) + 1] = key.mValue.y;
        values[(i * 3) + 2] = key.mValue.z;
    }

    sampler.input = GetSamplerInputRef(asset, animId, buffer, times);
    sampler.output = ExportData(asset, animId, buffer, numKeyframes, &values[0], AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
    sampler.interpolation = Interpolation_LINEAR;
}